

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int buffer_encrypt_record(ptls_buffer_t *buf,size_t rec_start,st_ptls_traffic_protection_t *enc)

{
  ulong __size;
  uint8_t type;
  int iVar1;
  size_t sVar2;
  uint8_t *src;
  size_t sVar3;
  uint8_t *puVar4;
  
  puVar4 = buf->base;
  sVar3 = buf->off - rec_start;
  __size = sVar3 - 5;
  type = puVar4[rec_start];
  if (__size < 0x4001) {
    sVar3 = enc->aead->algo->tag_size + 1;
    iVar1 = ptls_buffer_reserve(buf,sVar3);
    if (iVar1 == 0) {
      sVar2 = aead_encrypt(enc,buf->base + rec_start + 5,buf->base + rec_start + 5,__size,type);
      if (sVar2 != __size + sVar3) {
        __assert_fail("encrypted_len == bodylen + overhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0x2c2,
                      "int buffer_encrypt_record(ptls_buffer_t *, size_t, struct st_ptls_traffic_protection_t *)"
                     );
      }
      buf->off = buf->off + sVar3;
      buf->base[rec_start] = '\x17';
      buf->base[rec_start + 3] = (uint8_t)(sVar2 >> 8);
      buf->base[rec_start + 4] = (uint8_t)sVar2;
      iVar1 = 0;
    }
  }
  else {
    src = (uint8_t *)malloc(__size);
    if (src == (uint8_t *)0x0) {
      iVar1 = 0x201;
    }
    else {
      puVar4 = puVar4 + rec_start;
      memcpy(src,puVar4 + 5,__size);
      (*ptls_clear_memory)(puVar4,sVar3);
      buf->off = rec_start;
      iVar1 = buffer_push_encrypted_records(buf,type,src,__size,enc);
      (*ptls_clear_memory)(src,__size);
      free(src);
    }
  }
  return iVar1;
}

Assistant:

static int buffer_encrypt_record(ptls_buffer_t *buf, size_t rec_start, struct st_ptls_traffic_protection_t *enc)
{
    size_t bodylen = buf->off - rec_start - 5;
    uint8_t *tmpbuf, type = buf->base[rec_start];
    int ret;

    /* fast path: do in-place encryption if only one record needs to be emitted */
    if (bodylen <= PTLS_MAX_PLAINTEXT_RECORD_SIZE) {
        size_t overhead = 1 + enc->aead->algo->tag_size;
        if ((ret = ptls_buffer_reserve(buf, overhead)) != 0)
            return ret;
        size_t encrypted_len = aead_encrypt(enc, buf->base + rec_start + 5, buf->base + rec_start + 5, bodylen, type);
        assert(encrypted_len == bodylen + overhead);
        buf->off += overhead;
        buf->base[rec_start] = PTLS_CONTENT_TYPE_APPDATA;
        buf->base[rec_start + 3] = (encrypted_len >> 8) & 0xff;
        buf->base[rec_start + 4] = encrypted_len & 0xff;
        return 0;
    }

    /* move plaintext to temporary buffer */
    if ((tmpbuf = malloc(bodylen)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(tmpbuf, buf->base + rec_start + 5, bodylen);
    ptls_clear_memory(buf->base + rec_start, bodylen + 5);
    buf->off = rec_start;

    /* push encrypted records */
    ret = buffer_push_encrypted_records(buf, type, tmpbuf, bodylen, enc);

Exit:
    if (tmpbuf != NULL) {
        ptls_clear_memory(tmpbuf, bodylen);
        free(tmpbuf);
    }
    return ret;
}